

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_load_image_from_file
          (rf_image *__return_storage_ptr__,char *filename,rf_allocator allocator,
          rf_allocator temp_allocator,rf_io_callbacks io)

{
  rf_allocator temp_allocator_00;
  rf_allocator temp_allocator_01;
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_allocator_args rVar3;
  undefined1 auVar4 [16];
  rf_allocator_args rVar5;
  _Bool _Var6;
  ulong uVar7;
  void *src;
  uint uVar8;
  long in_FS_OFFSET;
  undefined4 uVar9;
  rf_allocator local_100;
  void *local_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  uint uStack_dc;
  char *local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  ulong uStack_b8;
  undefined4 local_b0;
  uint uStack_ac;
  char *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  char *local_90;
  char *pcStack_88;
  undefined8 local_80;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *local_60;
  char *pcStack_58;
  undefined8 local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  ulong src_size;
  
  local_100.user_data = temp_allocator.user_data;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  local_100.allocator_proc = temp_allocator.allocator_proc;
  _Var6 = rf_supports_image_file_type(filename);
  if (_Var6) {
    uVar7 = (*io.file_size_proc)(io.user_data,filename);
    if ((int)(uint)uVar7 < 1) {
      local_78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_70 = "rf_load_image_from_file";
      local_68 = 0x3d31;
      rf_log_impl(8,0x17aff2,(char *)0x3,filename);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3d31;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 3;
    }
    else {
      local_a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_a0 = "rf_load_image_from_file";
      local_98 = 0x3d1c;
      local_c0 = 0;
      uVar8 = (uint)uVar7 & 0x7fffffff;
      src_size = (ulong)uVar8;
      local_b0 = 0;
      rVar1.proc_name._0_4_ = 0x17afda;
      rVar1.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar1.proc_name._4_4_ = 0;
      rVar1.line_in_file = 0x3d1c;
      auVar4 = ZEXT416(uVar8) << 0x40;
      rVar3._16_8_ = (ulong)uStack_ac << 0x20;
      rVar3.pointer_to_free_or_realloc = (void *)auVar4._0_8_;
      rVar3.size_to_allocate_or_reallocate = auVar4._8_8_;
      uStack_b8 = src_size;
      src = (*temp_allocator.allocator_proc)(&local_100,rVar1,RF_AM_ALLOC,rVar3);
      if (src == (void *)0x0) {
        local_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_58 = "rf_load_image_from_file";
        local_50 = 0x3d2f;
        rf_log_impl(8,0x17b008,(char *)0x2,uVar7 & 0xffffffff);
        *(char **)(in_FS_OFFSET + -0x450) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file";
        *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3d2f;
        *(undefined4 *)(in_FS_OFFSET + -0x438) = 2;
      }
      else {
        _Var6 = (*io.read_file_proc)(io.user_data,filename,src,src_size);
        if (_Var6) {
          _Var6 = rf_is_file_extension(filename,".hdr");
          uVar9 = (undefined4)((ulong)local_100.allocator_proc >> 0x20);
          if (_Var6) {
            temp_allocator_00.allocator_proc._0_4_ = (int)local_100.allocator_proc;
            temp_allocator_00.user_data = local_100.user_data;
            temp_allocator_00.allocator_proc._4_4_ = uVar9;
            rf_load_image_from_hdr_file_data
                      (__return_storage_ptr__,src,src_size,allocator,temp_allocator_00);
          }
          else {
            temp_allocator_01.allocator_proc._0_4_ = (int)local_100.allocator_proc;
            temp_allocator_01.user_data = local_100.user_data;
            temp_allocator_01.allocator_proc._4_4_ = uVar9;
            rf_load_image_from_file_data
                      (__return_storage_ptr__,src,src_size,allocator,temp_allocator_01);
          }
        }
        else {
          local_48 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_40 = "rf_load_image_from_file";
          local_38 = 0x3d2b;
          rf_log_impl(8,0x17aff2,(char *)0x3,filename);
          *(char **)(in_FS_OFFSET + -0x450) =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file";
          *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3d2b;
          *(undefined4 *)(in_FS_OFFSET + -0x438) = 3;
        }
        local_d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_d0 = "rf_load_image_from_file";
        local_c8 = 0x3d2d;
        uStack_e8 = 0;
        local_e0 = 0;
        rVar2.proc_name._0_4_ = 0x17afda;
        rVar2.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar2.proc_name._4_4_ = 0;
        rVar2.line_in_file = 0x3d2d;
        rVar5.size_to_allocate_or_reallocate = 0;
        rVar5.pointer_to_free_or_realloc = src;
        rVar5._16_8_ = (ulong)uStack_dc << 0x20;
        local_f0 = src;
        (*local_100.allocator_proc)(&local_100,rVar2,RF_AM_FREE,rVar5);
      }
    }
  }
  else {
    local_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_88 = "rf_load_image_from_file";
    local_80 = 0x3d33;
    rf_log_impl(8,0x17b02f,(char *)0x9,filename);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3d33;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 9;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_file(const char* filename, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_image image = {0};

    if (rf_supports_image_file_type(filename))
    {
        int file_size = RF_FILE_SIZE(io, filename);

        if (file_size > 0)
        {
            unsigned char* image_file_buffer = RF_ALLOC(temp_allocator, file_size);

            if (image_file_buffer)
            {
                if (RF_READ_FILE(io, filename, image_file_buffer, file_size))
                {
                    if (rf_is_file_extension(filename, ".hdr"))
                    {
                        image = rf_load_image_from_hdr_file_data(image_file_buffer, file_size, allocator, temp_allocator);
                    }
                    else
                    {
                        image = rf_load_image_from_file_data(image_file_buffer, file_size, allocator, temp_allocator);
                    }
                }
                else RF_LOG_ERROR(RF_BAD_IO, "File size for %s is 0", filename);

                RF_FREE(temp_allocator, image_file_buffer);
            }
            else RF_LOG_ERROR(RF_BAD_ALLOC, "Temporary allocation of size %d failed", file_size);
        }
        else RF_LOG_ERROR(RF_BAD_IO, "File size for %s is 0", filename);
    }
    else RF_LOG_ERROR(RF_UNSUPPORTED, "Image fileformat not supported", filename);

    return image;
}